

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

SolveStatus
cptp_solve(Instance *instance,char *solver_name,SolverParams *params,Solution *solution,
          double timelimit,int32_t randomseed)

{
  char *pcVar1;
  SolveStatus SVar2;
  bool bVar3;
  char **ppcVar4;
  Instance *pIVar5;
  _Bool _Var6;
  int iVar7;
  SolveStatus SVar8;
  time_t tVar9;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int64_t iVar10;
  ulong uVar11;
  long lVar12;
  SolverDescriptor *pSVar13;
  char *__s2;
  char *pcVar14;
  SolverLookup *pSVar15;
  bool bVar16;
  SolverDescriptor *pSVar17;
  SolverParams *params_00;
  long lVar18;
  long in_FS_OFFSET;
  SolverTypedParams tparams;
  Solver solver;
  undefined8 in_stack_ffffffffffffff18;
  SolverTypedParams local_d0;
  SolverParams *local_c8;
  SolverDescriptor *local_c0;
  int local_b4;
  Solution *local_b0;
  Instance *local_a8;
  SolverLookup *local_a0;
  double local_98;
  SolverDescriptor *local_90;
  char *local_88;
  ulong local_80;
  SolverDescriptor *local_78;
  anon_struct_16_2_f84e2411 *local_70;
  TypedParam local_68;
  Solver local_58;
  
  uVar11 = (ulong)(uint)randomseed;
  local_98 = timelimit;
  iVar7 = strcmp(solver_name,"stub");
  if (iVar7 == 0) {
    local_a0 = SOLVERS_REGISTRY;
    local_c8 = params;
    local_b4 = iVar7;
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1bf,"%s :: Found descriptor for solver `%s`","cptp_solve",solver_name);
    if (randomseed == 0) {
      tVar9 = time((time_t *)0x0);
      uVar11 = (ulong)(uint)((int)tVar9 +
                            ((int)(SUB168(SEXT816(tVar9) * ZEXT816(0x8000000100000003),8) >> 0x1e) -
                            (SUB164(SEXT816(tVar9) * ZEXT816(0x8000000100000003),0xc) >> 0x1f)) *
                            -0x7fffffff);
    }
    printf("%s :: Setting seed = %d\n","cptp_solve",uVar11);
    local_80 = uVar11;
    srand((uint)uVar11);
    printf("%s :: Setting timelimit = %f\n",local_98,"cptp_solve");
    if (0x100 < local_c8->num_params) {
      __assert_fail("params->num_params <= MAX_NUM_SOLVER_PARAMS",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                    ,0xf2,
                    "_Bool verify_solver_params(const SolverDescriptor *, const SolverParams *)");
    }
    local_c0 = local_a0->descriptor;
    local_90 = local_c0 + 1;
    pcVar1 = local_c0[1].name;
    params_00 = local_c8;
    local_b0 = solution;
    local_a8 = instance;
    local_88 = solver_name;
    if (pcVar1 != (char *)0x0) {
      pSVar13 = local_c0 + 5;
      lVar18 = 0;
      pcVar14 = pcVar1;
      do {
        lVar12 = 0;
        __s2 = pcVar1;
        pSVar17 = pSVar13;
        do {
          if ((lVar18 != lVar12) && (iVar7 = strcmp(pcVar14,__s2), iVar7 == 0)) {
            log_log(0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                    ,0x102,
                    "%s :: INTERNAL ERROR! Solver descriptor lists duplicate param `%s` (error index i: %d, j: %d"
                    ,"verify_solver_params",pcVar14,
                    CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)lVar18),
                    (int)lVar12);
            __assert_fail("!\"Internal error\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                          ,0x104,
                          "_Bool verify_solver_params(const SolverDescriptor *, const SolverParams *)"
                         );
          }
          params_00 = local_c8;
          lVar12 = lVar12 + 1;
          __s2 = pSVar17->name;
          pSVar17 = pSVar17 + 4;
        } while (__s2 != (char *)0x0);
        lVar18 = lVar18 + 1;
        pcVar14 = local_90[lVar18 * 4].name;
      } while (pcVar14 != (char *)0x0);
      if (pcVar1 != (char *)0x0) {
        pSVar13 = local_c0 + 5;
        do {
          pcVar1 = pSVar13[-2].name;
          local_68.field_2.dval = 0.0;
          local_68._0_8_ = (ulong)*(ParamType *)&pSVar13[-3].name << 0x20;
          if (((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) &&
             (_Var6 = parse_solver_param_val(&local_68,pcVar1,*(ParamType *)&pSVar13[-3].name),
             !_Var6)) {
            log_log(0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                    ,0x116,
                    "%s :: Solver descriptor specifies an invalid default value `%s` for parameter `%s`"
                    ,"verify_solver_params",pcVar1,pSVar13[-4].name);
            __assert_fail("parse_success",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                          ,0x119,
                          "_Bool verify_solver_params(const SolverDescriptor *, const SolverParams *)"
                         );
          }
          ppcVar4 = &pSVar13->name;
          pSVar13 = pSVar13 + 4;
        } while (*ppcVar4 != (char *)0x0);
      }
    }
    bVar3 = true;
    if (0 < params_00->num_params) {
      local_70 = params_00->params;
      local_78 = local_c0 + 5;
      lVar18 = 0;
      do {
        pcVar1 = local_70[lVar18].name;
        pcVar14 = local_90->name;
        if (pcVar14 == (char *)0x0) {
LAB_00105979:
          bVar3 = false;
          log_log(0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                  ,300,"%s :: Solver `%s` does not accept param `%s`","verify_solver_params",
                  local_c0->name,pcVar1);
        }
        else {
          bVar16 = false;
          pSVar13 = local_78;
          do {
            iVar7 = strcmp(pcVar1,pcVar14);
            if (iVar7 == 0) {
              bVar16 = true;
              break;
            }
            pcVar14 = pSVar13->name;
            pSVar13 = pSVar13 + 4;
          } while (pcVar14 != (char *)0x0);
          params_00 = local_c8;
          if (!bVar16) goto LAB_00105979;
        }
        lVar18 = lVar18 + 1;
        iVar7 = params_00->num_params;
        if (0xff < iVar7) {
          iVar7 = 0x100;
        }
      } while (lVar18 < iVar7);
    }
    if (bVar3) {
      local_d0.entries = (SolverTypedParamsEntry *)0x0;
      _Var6 = resolve_params(params_00,local_a0->descriptor,&local_d0);
      pIVar5 = local_a8;
      solution = local_b0;
      if (_Var6) {
        pSVar15 = SOLVERS_REGISTRY;
        if (local_b4 != 0) {
          pSVar15 = (SolverLookup *)0x0;
        }
        (*pSVar15->create_fn)(&local_58,local_a8,&local_d0,local_98,(int32_t)local_80);
        local_58.sigterm_occured = false;
        local_58.sigterm_occured_int = 0;
        *(Solver **)(in_FS_OFFSET + -8) = &local_58;
        __handler = signal(0xf,cptp_sighandler);
        __handler_00 = signal(2,cptp_sighandler);
        iVar10 = os_get_nanosecs();
        SVar8 = (*local_58.solve)(&local_58,pIVar5,solution,iVar10 / 1000);
        signal(0xf,__handler);
        signal(2,__handler_00);
        *(undefined8 *)(in_FS_OFFSET + -8) = 0;
        SVar2 = SVar8 | SOLVE_STATUS_ABORTION_SIGTERM;
        if (local_58.sigterm_occured == false) {
          SVar2 = SVar8;
        }
        (*local_58.destroy)(&local_58);
        log_log(0x20,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                ,0x17b,"Solver `%s` returned with solve status: %x",local_88,(ulong)SVar2);
        if ((SVar2 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) == SOLVE_STATUS_NULL) {
          if (((SVar2 & SOLVE_STATUS_CLOSED_PROBLEM) != SOLVE_STATUS_NULL) &&
             (-1000.0 <=
              (solution->primal_bound - solution->dual_bound) /
              (ABS(solution->primal_bound) + 1e-10))) {
            __assert_fail("gap < -1000.0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                          ,0x194,
                          "void postprocess_solver_solution(const Instance *, SolveStatus, Solution *)"
                         );
          }
        }
        else {
          validate_primal_solution(local_a8,solution,1);
          if (((SVar2 & SOLVE_STATUS_CLOSED_PROBLEM) != SOLVE_STATUS_NULL) &&
             (0.06 < ABS((solution->primal_bound - solution->dual_bound) /
                         (ABS(solution->primal_bound) + 1e-10)))) {
            __assert_fail("feq(gap, 0.0, SIX_PERCENT)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                          ,0x18d,
                          "void postprocess_solver_solution(const Instance *, SolveStatus, Solution *)"
                         );
          }
        }
        if (SVar2 == SOLVE_STATUS_NULL || (SVar2 & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL) {
          solution->dual_bound = INFINITY;
          solution->primal_bound = 0.0;
          tour_clear(&solution->tour);
        }
        if (local_d0.entries == (SolverTypedParamsEntry *)0x0) {
          return SVar2;
        }
        stbds_hmfree_func(local_d0.entries + -1,0x18);
        return SVar2;
      }
      cptp_solve_cold_2();
    }
    else {
      cptp_solve_cold_1();
      solution = local_b0;
    }
  }
  else {
    log_log(0x80,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1bb,"%s :: `%s` is not a know solver","cptp_solve",solver_name);
  }
  solution->dual_bound = INFINITY;
  solution->primal_bound = 0.0;
  tour_clear(&solution->tour);
  return SOLVE_STATUS_NULL;
}

Assistant:

SolveStatus cptp_solve(const Instance *instance, const char *solver_name,
                       const SolverParams *params, Solution *solution,
                       double timelimit, int32_t randomseed) {
    SolveStatus status = SOLVE_STATUS_NULL;
    const SolverLookup *lookup = lookup_solver(solver_name);

    if (lookup == NULL) {
        log_fatal("%s :: `%s` is not a know solver", __func__, solver_name);
        goto fail;
    } else {
        log_info("%s :: Found descriptor for solver `%s`", __func__,
                 solver_name);
    }

    if (randomseed == 0) {
        randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    printf("%s :: Setting seed = %d\n", __func__, randomseed);
    srand(randomseed);

    printf("%s :: Setting timelimit = %f\n", __func__, timelimit);

    if (!verify_solver_params(lookup->descriptor, params)) {
        fprintf(stderr, "ERROR: %s :: Failed to verify params\n", __func__);
        goto fail;
    }

    SolverTypedParams tparams = {0};

    if (!resolve_params(params, lookup->descriptor, &tparams)) {
        fprintf(stderr, "ERROR: %s :: Failed to resolve parameters\n",
                __func__);
        goto fail;
    }

    Solver solver =
        lookup->create_fn(instance, &tparams, timelimit, randomseed);

    {
        solver.sigterm_occured = false;
        solver.sigterm_occured_int = 0;

        // Setup signals
        sighandler_ctx_solver_ptr = &solver;
        sighandler_t prev_sigterm_handler = signal(SIGTERM, cptp_sighandler);
        sighandler_t prev_sigint_handler = signal(SIGINT, cptp_sighandler);
        {
            int64_t begin_time = os_get_usecs();
            status = solver.solve(&solver, instance, solution, begin_time);
        }
        // Resets the signals
        signal(SIGTERM, prev_sigterm_handler);
        signal(SIGINT, prev_sigint_handler);
        sighandler_ctx_solver_ptr = NULL;
    }

    if (solver.sigterm_occured) {
        status |= SOLVE_STATUS_ABORTION_SIGTERM;
    }

    solver.destroy(&solver);
    log_solve_status(status, solver_name);
    postprocess_solver_solution(instance, status, solution);
    solver_typed_params_destroy(&tparams);
    return status;

fail:
    solution_clear(solution);
    return status;
}